

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O3

Float __thiscall pbrt::SummedAreaTable::Lookup(SummedAreaTable *this,Float x,Float y)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  int x_00;
  Float FVar4;
  Float FVar5;
  Float FVar6;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 in_register_00001204 [60];
  undefined1 auVar7 [64];
  int y_00;
  undefined1 auVar8 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 extraout_var [60];
  
  auVar12._4_60_ = in_register_00001244;
  auVar12._0_4_ = y;
  auVar7._4_60_ = in_register_00001204;
  auVar7._0_4_ = x;
  auVar1 = vinsertps_avx(auVar7._0_16_,auVar12._0_16_,0x10);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = (this->sum).extent.pMax.super_Tuple2<pbrt::Point2,_int>;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (this->sum).extent.pMin.super_Tuple2<pbrt::Point2,_int>;
  auVar2 = vpsubd_avx(auVar13,auVar14);
  auVar2 = vcvtdq2ps_avx(auVar2);
  fVar3 = auVar1._0_4_ * auVar2._0_4_;
  fVar9 = auVar1._4_4_ * auVar2._4_4_;
  fVar10 = auVar1._8_4_ * auVar2._8_4_;
  fVar11 = auVar1._12_4_ * auVar2._12_4_;
  x_00 = (int)fVar3;
  y_00 = (int)fVar9;
  FVar4 = LookupInt(this,x_00,y_00);
  FVar5 = LookupInt(this,x_00 + 1,y_00);
  FVar6 = LookupInt(this,x_00,y_00 + 1);
  auVar8._0_4_ = LookupInt(this,x_00 + 1,y_00 + 1);
  auVar8._4_60_ = extraout_var;
  auVar2._4_4_ = y_00;
  auVar2._0_4_ = x_00;
  auVar2._8_4_ = (int)fVar10;
  auVar2._12_4_ = (int)fVar11;
  auVar2 = vcvtdq2ps_avx(auVar2);
  auVar1._4_4_ = fVar9;
  auVar1._0_4_ = fVar3;
  auVar1._8_4_ = fVar10;
  auVar1._12_4_ = fVar11;
  auVar1 = vsubps_avx(auVar1,auVar2);
  auVar2 = vmovshdup_avx(auVar1);
  fVar3 = auVar1._0_4_;
  fVar9 = auVar2._0_4_;
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)((1.0 - fVar3) * fVar9 * FVar6)),
                           ZEXT416((uint)((1.0 - fVar3) * (1.0 - fVar9))),ZEXT416((uint)FVar4));
  auVar2 = vfmadd132ss_fma(ZEXT416((uint)(fVar3 * (1.0 - fVar9))),auVar2,ZEXT416((uint)FVar5));
  auVar2 = vfmadd213ss_fma(auVar8._0_16_,ZEXT416((uint)(fVar3 * fVar9)),auVar2);
  return auVar2._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float Lookup(Float x, Float y) const {
        // Rescale $(x,y)$ to table resolution and compute integer coordinates
        x *= sum.xSize();
        y *= sum.ySize();
        int x0 = (int)x, y0 = (int)y;

        // Bilinearly interpolate between surrounding table values
        Float v00 = LookupInt(x0, y0), v10 = LookupInt(x0 + 1, y0);
        Float v01 = LookupInt(x0, y0 + 1), v11 = LookupInt(x0 + 1, y0 + 1);
        Float dx = x - int(x), dy = y - int(y);
        return (1 - dx) * (1 - dy) * v00 + (1 - dx) * dy * v01 + dx * (1 - dy) * v10 +
               dx * dy * v11;
    }